

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestComparisonsF<Counter<unsigned_short,16u>>(void)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  short sVar7;
  uint ii;
  int iVar8;
  bool bVar9;
  
  bVar9 = false;
  sVar2 = -1;
  sVar3 = 1;
  sVar4 = 0x3e9;
  uVar5 = 0;
  do {
    uVar6 = uVar5 + 1;
    iVar8 = 0;
    do {
      sVar1 = (short)iVar8;
      sVar7 = sVar3 + sVar1;
      if (-1 < (short)((sVar2 + sVar1) - sVar7 & sVar1 - sVar7)) {
        return bVar9;
      }
      if (sVar7 < (short)(sVar2 + sVar1)) {
        return bVar9;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 1000);
    sVar7 = sVar2 + 1000;
    iVar8 = 0;
    do {
      sVar1 = sVar4 + (short)iVar8;
      if (-1 < (short)(sVar7 - sVar1 & ((short)iVar8 - sVar1) + 1000U)) {
        return bVar9;
      }
      if (sVar1 < sVar7) {
        return bVar9;
      }
      sVar7 = sVar7 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != -2000);
    bVar9 = 1 < uVar5;
    sVar2 = sVar2 + -1;
    sVar3 = sVar3 + 1;
    sVar4 = sVar4 + 1;
    uVar5 = uVar6;
    if (uVar6 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}